

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void RGB24ToARGBRow_C(uint8_t *src_rgb24,uint8_t *dst_argb,int width)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t r;
  uint8_t g;
  uint8_t b;
  int x;
  int width_local;
  uint8_t *dst_argb_local;
  uint8_t *src_rgb24_local;
  
  dst_argb_local = dst_argb;
  src_rgb24_local = src_rgb24;
  for (x = 0; x < width; x = x + 1) {
    uVar1 = src_rgb24_local[1];
    uVar2 = src_rgb24_local[2];
    *dst_argb_local = *src_rgb24_local;
    dst_argb_local[1] = uVar1;
    dst_argb_local[2] = uVar2;
    dst_argb_local[3] = 0xff;
    dst_argb_local = dst_argb_local + 4;
    src_rgb24_local = src_rgb24_local + 3;
  }
  return;
}

Assistant:

void RGB24ToARGBRow_C(const uint8_t* src_rgb24, uint8_t* dst_argb, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_rgb24[0];
    uint8_t g = src_rgb24[1];
    uint8_t r = src_rgb24[2];
    dst_argb[0] = b;
    dst_argb[1] = g;
    dst_argb[2] = r;
    dst_argb[3] = 255u;
    dst_argb += 4;
    src_rgb24 += 3;
  }
}